

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::CompactRange(DBImpl *this,Slice *begin,Slice *end)

{
  Version *this_00;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  int level;
  int iVar4;
  Mutex *__mutex;
  long in_FS_OFFSET;
  DB local_40;
  Env *local_38;
  
  local_38 = *(Env **)(in_FS_OFFSET + 0x28);
  __mutex = &this->mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    this_00 = this->versions_->current_;
    iVar4 = 1;
    iVar2 = 1;
    do {
      bVar1 = Version::OverlapInLevel(this_00,iVar4,begin,end);
      if (bVar1) {
        iVar2 = iVar4;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 7);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffc0);
    if (local_40._vptr_DB != (_func_int **)0x0) {
      operator_delete__(local_40._vptr_DB);
    }
    if (0 < iVar2) {
      iVar4 = 0;
      do {
        TEST_CompactRange(this,iVar4,begin,end);
        iVar4 = iVar4 + 1;
      } while (iVar2 != iVar4);
    }
    if (*(Env **)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(Env **)(in_FS_OFFSET + 0x28) == local_38) {
    uVar3 = std::__throw_system_error(iVar2);
    if (*(Env **)(in_FS_OFFSET + 0x28) == local_38) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar3);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::CompactRange(const Slice* begin, const Slice* end) {
  int max_level_with_files = 1;
  {
    MutexLock l(&mutex_);
    Version* base = versions_->current();
    for (int level = 1; level < config::kNumLevels; level++) {
      if (base->OverlapInLevel(level, begin, end)) {
        max_level_with_files = level;
      }
    }
  }
  TEST_CompactMemTable();  // TODO(sanjay): Skip if memtable does not overlap
  for (int level = 0; level < max_level_with_files; level++) {
    TEST_CompactRange(level, begin, end);
  }
}